

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cc
# Opt level: O0

void default_signal_handler(int signalnr)

{
  uint in_EDI;
  int ret;
  int local_8;
  
  Minisat::Solver::interrupt(solver);
  local_8 = 0;
  if (in_EDI == 0x18) {
    local_8 = 0x7c;
  }
  if (in_EDI == 0xb) {
    local_8 = 0x8b;
  }
  if (((default_signal_handler::interrupted & 1U) == 0) && (local_8 == 0)) {
    default_signal_handler::interrupted = true;
    return;
  }
  if (0 < *(int *)(solver + 0x34)) {
    printf("c\nc *** caught signal %d ***\nc\n",(ulong)in_EDI);
    printStats((Solver *)0x10be9e);
    printf("c\n");
    printf("c *** INTERRUPTED ***\n");
  }
  _exit(local_8);
}

Assistant:

static void default_signal_handler(int signalnr)
{
    static bool interrupted = false;
    solver->interrupt();

    int ret = 0;
    if (signalnr == SIGXCPU) ret = 124;
    if (signalnr == SIGSEGV) ret = 139;
    if (interrupted || ret != 0) {
        if (solver->verbosity > 0) {
            printf("c\nc *** caught signal %d ***\nc\n", signalnr);
            printStats(*solver);
            printf("c\n");
            printf("c *** INTERRUPTED ***\n");
        }
        _exit(ret);
    }

    interrupted = true;
}